

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O2

void __thiscall CLParam<double>::PrintSimple(CLParam<double> *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&this->parameter_name);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>(this->value);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void PrintSimple()
    {
        std::cout << parameter_name << " " << value << std::endl ;
    }